

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_h16_and_colon(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  curi_status cVar2;
  char *pcVar3;
  
  cVar2 = parse_h16(uri,len,offset,settings,userData);
  if (cVar2 == curi_status_success) {
    uVar1 = *offset;
    pcVar3 = "";
    if (uVar1 < len) {
      pcVar3 = uri + uVar1;
    }
    *offset = uVar1 + 1;
    cVar2 = (uint)(*pcVar3 != ':') * 2;
  }
  return cVar2;
}

Assistant:

static curi_status parse_h16_and_colon(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // h16_and_colon = h16 ":"
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_h16(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    return status;
}